

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

BZFILE * bzopen_or_bzdopen(char *path,int fd,char *mode,int open_mode)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  char *__src;
  BZFILE *local_1400;
  int local_13ec;
  int nUnused;
  int smallMode;
  int workFactor;
  int verbosity;
  BZFILE *bzfp;
  FILE *fp;
  char mode2 [10];
  int writing;
  int blockSize100k;
  char unused [5000];
  int bzerr;
  int open_mode_local;
  char *mode_local;
  int fd_local;
  char *path_local;
  
  mode2[6] = '\t';
  mode2[7] = '\0';
  mode2[8] = '\0';
  mode2[9] = '\0';
  mode2[2] = '\0';
  mode2[3] = '\0';
  mode2[4] = '\0';
  mode2[5] = '\0';
  unused._4996_4_ = open_mode;
  memset((void *)((long)&fp + 6),0,10);
  local_13ec = 0;
  _bzerr = mode;
  if (mode == (char *)0x0) {
    path_local = (char *)0x0;
  }
  else {
    for (; *_bzerr != '\0'; _bzerr = _bzerr + 1) {
      cVar1 = *_bzerr;
      if (cVar1 == 'r') {
        mode2[2] = '\0';
        mode2[3] = '\0';
        mode2[4] = '\0';
        mode2[5] = '\0';
      }
      else if (cVar1 == 's') {
        local_13ec = 1;
      }
      else if (cVar1 == 'w') {
        mode2[2] = '\x01';
        mode2[3] = '\0';
        mode2[4] = '\0';
        mode2[5] = '\0';
      }
      else {
        ppuVar3 = __ctype_b_loc();
        if (((*ppuVar3)[(int)*_bzerr] & 0x800) != 0) {
          mode2._6_4_ = *_bzerr + -0x30;
        }
      }
    }
    __src = "r";
    if (mode2._2_4_ != 0) {
      __src = "w";
    }
    strcat((char *)((long)&fp + 6),__src);
    strcat((char *)((long)&fp + 6),"b");
    if (unused._4996_4_ == 0) {
      if ((path == (char *)0x0) || (iVar2 = strcmp(path,""), iVar2 == 0)) {
        if (mode2._2_4_ == 0) {
          local_1400 = _stdin;
        }
        else {
          local_1400 = _stdout;
        }
        bzfp = local_1400;
      }
      else {
        bzfp = fopen(path,(char *)((long)&fp + 6));
      }
    }
    else {
      bzfp = fdopen(fd,(char *)((long)&fp + 6));
    }
    if (bzfp == (BZFILE *)0x0) {
      path_local = (char *)0x0;
    }
    else {
      if (mode2._2_4_ == 0) {
        _workFactor = (char *)BZ2_bzReadOpen((int *)(unused + 0x1380),(FILE *)bzfp,0,local_13ec,
                                             &writing,0);
      }
      else {
        if ((int)mode2._6_4_ < 1) {
          mode2[6] = '\x01';
          mode2[7] = '\0';
          mode2[8] = '\0';
          mode2[9] = '\0';
        }
        if (9 < (int)mode2._6_4_) {
          mode2[6] = '\t';
          mode2[7] = '\0';
          mode2[8] = '\0';
          mode2[9] = '\0';
        }
        _workFactor = (char *)BZ2_bzWriteOpen((int *)(unused + 0x1380),(FILE *)bzfp,mode2._6_4_,0,
                                              0x1e);
      }
      if (_workFactor == (char *)0x0) {
        if ((bzfp != _stdin) && (bzfp != _stdout)) {
          fclose((FILE *)bzfp);
        }
        path_local = (char *)0x0;
      }
      else {
        path_local = _workFactor;
      }
    }
  }
  return path_local;
}

Assistant:

static
BZFILE * bzopen_or_bzdopen
               ( const char *path,   /* no use when bzdopen */
                 int fd,             /* no use when bzdopen */
                 const char *mode,
                 int open_mode)      /* bzopen: 0, bzdopen:1 */
{
   int    bzerr;
   char   unused[BZ_MAX_UNUSED];
   int    blockSize100k = 9;
   int    writing       = 0;
   char   mode2[10]     = "";
   FILE   *fp           = NULL;
   BZFILE *bzfp         = NULL;
   int    verbosity     = 0;
   int    workFactor    = 30;
   int    smallMode     = 0;
   int    nUnused       = 0; 

   if (mode == NULL) return NULL;
   while (*mode) {
      switch (*mode) {
      case 'r':
         writing = 0; break;
      case 'w':
         writing = 1; break;
      case 's':
         smallMode = 1; break;
      default:
         if (isdigit((int)(*mode))) {
            blockSize100k = *mode-BZ_HDR_0;
         }
      }
      mode++;
   }
   strcat(mode2, writing ? "w" : "r" );
   strcat(mode2,"b");   /* binary mode */

   if (open_mode==0) {
      if (path==NULL || strcmp(path,"")==0) {
        fp = (writing ? stdout : stdin);
        SET_BINARY_MODE(fp);
      } else {
        fp = fopen(path,mode2);
      }
   } else {
#ifdef BZ_STRICT_ANSI
      fp = NULL;
#else
      fp = fdopen(fd,mode2);
#endif
   }
   if (fp == NULL) return NULL;

   if (writing) {
      /* Guard against total chaos and anarchy -- JRS */
      if (blockSize100k < 1) blockSize100k = 1;
      if (blockSize100k > 9) blockSize100k = 9; 
      bzfp = BZ2_bzWriteOpen(&bzerr,fp,blockSize100k,
                             verbosity,workFactor);
   } else {
      bzfp = BZ2_bzReadOpen(&bzerr,fp,verbosity,smallMode,
                            unused,nUnused);
   }
   if (bzfp == NULL) {
      if (fp != stdin && fp != stdout) fclose(fp);
      return NULL;
   }
   return bzfp;
}